

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
::~Vector_column(Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                 *this)

{
  bool bVar1;
  reference ppEVar2;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range2;
  Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *this_local;
  
  __end0 = std::
           vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
           ::begin(&this->column_);
  entry = (Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
           *)std::
             vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
             ::end(&this->column_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>_>
              ::operator*(&__end0);
    _delete_entry(this,*ppEVar2);
    __gnu_cxx::
    __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>_>
    ::operator++(&__end0);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set(&this->erasedValues_);
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ::~vector(&this->column_);
  return;
}

Assistant:

inline Vector_column<Master_matrix>::~Vector_column()
{
  for (auto* entry : column_) {
    _delete_entry(entry);
  }
}